

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateDescriptorMethods
          (ImmutableMessageGenerator *this,Printer *printer)

{
  ClassNameResolver *pCVar1;
  Printer *pPVar2;
  bool bVar3;
  int iVar4;
  JavaType JVar5;
  int iVar6;
  MessageOptions *this_00;
  FileDescriptor *pFVar7;
  Descriptor *descriptor;
  ulong uVar8;
  size_type sVar9;
  reference ppFVar10;
  Descriptor *descriptor_00;
  AlphaNum *a;
  Descriptor *descriptor_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  string local_138;
  string local_118;
  AlphaNum local_f8;
  string local_c8;
  FieldGeneratorInfo *local_a8;
  FieldGeneratorInfo *info;
  FieldDescriptor *field_1;
  FieldDescriptor *pFStack_90;
  int i_1;
  FieldDescriptor *field;
  undefined1 local_80 [4];
  int i;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  map_fields;
  string local_58;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMessageGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  this_00 = Descriptor::options((this->super_MessageGenerator).descriptor_);
  bVar3 = MessageOptions::no_standard_descriptor_accessor(this_00);
  pPVar2 = local_18;
  if (!bVar3) {
    pCVar1 = this->name_resolver_;
    pFVar7 = Descriptor::file((this->super_MessageGenerator).descriptor_);
    ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
              (&local_38,pCVar1,pFVar7);
    UniqueFileScopeIdentifier_abi_cxx11_
              (&local_58,(java *)(this->super_MessageGenerator).descriptor_,descriptor_00);
    io::Printer::Print<char[10],std::__cxx11::string,char[11],std::__cxx11::string>
              (pPVar2,
               "public static final com.google.protobuf.Descriptors.Descriptor\n    getDescriptor() {\n  return $fileclass$.internal_$identifier$_descriptor;\n}\n\n"
               ,(char (*) [10])"fileclass",&local_38,(char (*) [11])0x76db2e,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_80);
  for (field._4_4_ = 0; iVar6 = field._4_4_,
      iVar4 = Descriptor::field_count((this->super_MessageGenerator).descriptor_), iVar6 < iVar4;
      field._4_4_ = field._4_4_ + 1) {
    pFStack_90 = Descriptor::field((this->super_MessageGenerator).descriptor_,field._4_4_);
    JVar5 = GetJavaType(pFStack_90);
    if (JVar5 == JAVATYPE_MESSAGE) {
      descriptor = FieldDescriptor::message_type(pFStack_90);
      bVar3 = IsMapEntry(descriptor);
      if (bVar3) {
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)local_80,&stack0xffffffffffffff70);
      }
    }
  }
  bVar3 = std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::empty((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)local_80);
  if (!bVar3) {
    io::Printer::Print<>
              (local_18,
               "@SuppressWarnings({\"rawtypes\"})\n@java.lang.Override\nprotected com.google.protobuf.MapField internalGetMapField(\n    int number) {\n  switch (number) {\n"
              );
    io::Printer::Indent(local_18);
    io::Printer::Indent(local_18);
    for (field_1._4_4_ = 0; uVar8 = (ulong)field_1._4_4_,
        sVar9 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        *)local_80), uVar8 < sVar9; field_1._4_4_ = field_1._4_4_ + 1) {
      ppFVar10 = std::
                 vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               *)local_80,(long)field_1._4_4_);
      info = (FieldGeneratorInfo *)*ppFVar10;
      local_a8 = Context::GetFieldGeneratorInfo(this->context_,(FieldDescriptor *)info);
      pPVar2 = local_18;
      iVar6 = FieldDescriptor::number((FieldDescriptor *)info);
      strings::AlphaNum::AlphaNum(&local_f8,iVar6);
      StrCat_abi_cxx11_(&local_c8,(protobuf *)&local_f8,a);
      io::Printer::Print<char[7],std::__cxx11::string,char[17],std::__cxx11::string>
                (pPVar2,"case $number$:\n  return internalGet$capitalized_name$();\n",
                 (char (*) [7])0x79279d,&local_c8,(char (*) [17])0x7922b3,
                 &local_a8->capitalized_name);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    io::Printer::Print<>
              (local_18,
               "default:\n  throw new RuntimeException(\n      \"Invalid map field number: \" + number);\n"
              );
    io::Printer::Outdent(local_18);
    io::Printer::Outdent(local_18);
    io::Printer::Print<>(local_18,"  }\n}\n");
  }
  pPVar2 = local_18;
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_118,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  pCVar1 = this->name_resolver_;
  pFVar7 = Descriptor::file((this->super_MessageGenerator).descriptor_);
  ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
            (&local_138,pCVar1,pFVar7);
  UniqueFileScopeIdentifier_abi_cxx11_
            (&local_158,(java *)(this->super_MessageGenerator).descriptor_,descriptor_01);
  GeneratedCodeVersionSuffix_abi_cxx11_();
  io::Printer::
  Print<char[10],std::__cxx11::string,char[10],std::__cxx11::string,char[11],std::__cxx11::string,char[4],std::__cxx11::string>
            (pPVar2,
             "@java.lang.Override\nprotected com.google.protobuf.GeneratedMessage$ver$.FieldAccessorTable\n    internalGetFieldAccessorTable() {\n  return $fileclass$.internal_$identifier$_fieldAccessorTable\n      .ensureFieldAccessorsInitialized(\n          $classname$.class, $classname$.Builder.class);\n}\n\n"
             ,(char (*) [10])0x77c586,&local_118,(char (*) [10])"fileclass",&local_138,
             (char (*) [11])0x76db2e,&local_158,(char (*) [4])0x76cf09,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)local_80);
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateDescriptorMethods(
    io::Printer* printer) {
  if (!descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print(
        "public static final com.google.protobuf.Descriptors.Descriptor\n"
        "    getDescriptor() {\n"
        "  return $fileclass$.internal_$identifier$_descriptor;\n"
        "}\n"
        "\n",
        "fileclass", name_resolver_->GetImmutableClassName(descriptor_->file()),
        "identifier", UniqueFileScopeIdentifier(descriptor_));
  }
  std::vector<const FieldDescriptor*> map_fields;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (GetJavaType(field) == JAVATYPE_MESSAGE &&
        IsMapEntry(field->message_type())) {
      map_fields.push_back(field);
    }
  }
  if (!map_fields.empty()) {
    printer->Print(
        "@SuppressWarnings({\"rawtypes\"})\n"
        "@java.lang.Override\n"
        "protected com.google.protobuf.MapField internalGetMapField(\n"
        "    int number) {\n"
        "  switch (number) {\n");
    printer->Indent();
    printer->Indent();
    for (int i = 0; i < map_fields.size(); ++i) {
      const FieldDescriptor* field = map_fields[i];
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      printer->Print(
          "case $number$:\n"
          "  return internalGet$capitalized_name$();\n",
          "number", StrCat(field->number()), "capitalized_name",
          info->capitalized_name);
    }
    printer->Print(
        "default:\n"
        "  throw new RuntimeException(\n"
        "      \"Invalid map field number: \" + number);\n");
    printer->Outdent();
    printer->Outdent();
    printer->Print(
        "  }\n"
        "}\n");
  }
  printer->Print(
      "@java.lang.Override\n"
      "protected com.google.protobuf.GeneratedMessage$ver$.FieldAccessorTable\n"
      "    internalGetFieldAccessorTable() {\n"
      "  return $fileclass$.internal_$identifier$_fieldAccessorTable\n"
      "      .ensureFieldAccessorsInitialized(\n"
      "          $classname$.class, $classname$.Builder.class);\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_),
      "fileclass", name_resolver_->GetImmutableClassName(descriptor_->file()),
      "identifier", UniqueFileScopeIdentifier(descriptor_), "ver",
      GeneratedCodeVersionSuffix());
}